

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::printQuantizationHelp(Args *this)

{
  ostream *poVar1;
  Args *this_00;
  long in_RDI;
  undefined8 in_stack_ffffffffffffff40;
  bool b;
  Args *in_stack_ffffffffffffff48;
  string local_78 [32];
  string local_58 [48];
  string local_28 [40];
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "\nThe following arguments for quantization are optional:\n");
  poVar1 = std::operator<<(poVar1,"  -cutoff             number of words and ngrams to retain [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0x118));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,
                           "  -retrain            whether embeddings are finetuned if a cutoff is applied ["
                          );
  b = SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0);
  boolToString_abi_cxx11_(in_stack_ffffffffffffff48,b);
  poVar1 = std::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -qnorm              whether the norm is quantized separately ["
                          );
  boolToString_abi_cxx11_(in_stack_ffffffffffffff48,b);
  poVar1 = std::operator<<(poVar1,local_58);
  this_00 = (Args *)std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<((ostream *)this_00,
                           "  -qout               whether the classifier is quantized [");
  boolToString_abi_cxx11_(this_00,SUB81((ulong)poVar1 >> 0x38,0));
  poVar1 = std::operator<<(poVar1,local_78);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -dsub               size of each sub-vector [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0x120));
  std::operator<<(poVar1,"]\n");
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Args::printQuantizationHelp() {
  std::cerr
      << "\nThe following arguments for quantization are optional:\n"
      << "  -cutoff             number of words and ngrams to retain ["
      << cutoff << "]\n"
      << "  -retrain            whether embeddings are finetuned if a cutoff "
         "is applied ["
      << boolToString(retrain) << "]\n"
      << "  -qnorm              whether the norm is quantized separately ["
      << boolToString(qnorm) << "]\n"
      << "  -qout               whether the classifier is quantized ["
      << boolToString(qout) << "]\n"
      << "  -dsub               size of each sub-vector [" << dsub << "]\n";
}